

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

int __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  FieldType FVar1;
  RepeatedField<int> *pRVar2;
  int *piVar3;
  _func_int *p_Var4;
  int iVar5;
  int iVar6;
  LogMessage *pLVar7;
  MessageLite *pMVar8;
  uint uVar9;
  uint uVar10;
  uint64 value;
  long lVar11;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (this->is_repeated == true) {
    FVar1 = this->type;
    if (this->is_packed != true) {
      if ((byte)(FVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x35);
        pLVar7 = LogMessage::operator<<
                           (&local_60,
                            "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_61,pLVar7);
        LogMessage::~LogMessage(&local_60);
      }
      iVar5 = 1;
      if (0x7f < (uint)(number << 3)) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(number << 3);
      }
      iVar5 = iVar5 << (FVar1 == '\n');
      FVar1 = this->type;
      if ((byte)(FVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x35);
        pLVar7 = LogMessage::operator<<
                           (&local_60,
                            "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_61,pLVar7);
        LogMessage::~LogMessage(&local_60);
      }
      switch(FVar1) {
      case '\x01':
      case '\x06':
      case '\x10':
        iVar5 = iVar5 + 8;
        break;
      case '\x02':
      case '\a':
      case '\x0f':
        iVar5 = iVar5 + 4;
        break;
      case '\x03':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            iVar6 = io::CodedOutputStream::VarintSize64((uint64)pMVar8->_vptr_MessageLite[lVar11]);
            iVar5 = iVar5 + iVar6;
            lVar11 = lVar11 + 1;
            pMVar8 = (this->field_0).message_value;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\x04':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            iVar6 = io::CodedOutputStream::VarintSize64((uint64)pMVar8->_vptr_MessageLite[lVar11]);
            iVar5 = iVar5 + iVar6;
            lVar11 = lVar11 + 1;
            pMVar8 = (this->field_0).message_value;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\x05':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            uVar9 = *(uint *)((long)pMVar8->_vptr_MessageLite + lVar11 * 4);
            if ((int)uVar9 < 0) {
              iVar6 = 10;
            }
            else {
              iVar6 = 1;
              if (0x7f < uVar9) {
                iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
                pMVar8 = (this->field_0).message_value;
              }
            }
            iVar5 = iVar5 + iVar6;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\b':
        iVar5 = iVar5 + 1;
        break;
      case '\t':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            p_Var4 = pMVar8->_vptr_MessageLite[lVar11];
            uVar9 = *(uint *)(p_Var4 + 8);
            iVar6 = 1;
            if (0x7f < uVar9) {
              iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
              uVar9 = *(uint *)(p_Var4 + 8);
              pMVar8 = (this->field_0).message_value;
            }
            iVar5 = iVar5 + iVar6 + uVar9;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\n':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            iVar6 = (**(code **)(*(long *)pMVar8->_vptr_MessageLite[lVar11] + 0x48))();
            iVar5 = iVar5 + iVar6;
            lVar11 = lVar11 + 1;
            pMVar8 = (this->field_0).message_value;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\v':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            uVar9 = (**(code **)(*(long *)pMVar8->_vptr_MessageLite[lVar11] + 0x48))();
            iVar6 = 1;
            if (0x7f < uVar9) {
              iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
            }
            iVar5 = iVar5 + uVar9 + iVar6;
            lVar11 = lVar11 + 1;
            pMVar8 = (this->field_0).message_value;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\f':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            p_Var4 = pMVar8->_vptr_MessageLite[lVar11];
            uVar9 = *(uint *)(p_Var4 + 8);
            iVar6 = 1;
            if (0x7f < uVar9) {
              iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
              uVar9 = *(uint *)(p_Var4 + 8);
              pMVar8 = (this->field_0).message_value;
            }
            iVar5 = iVar5 + iVar6 + uVar9;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\r':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            uVar9 = *(uint *)((long)pMVar8->_vptr_MessageLite + lVar11 * 4);
            iVar6 = 1;
            if (0x7f < uVar9) {
              iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
              pMVar8 = (this->field_0).message_value;
            }
            iVar5 = iVar5 + iVar6;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\x0e':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            uVar9 = *(uint *)((long)pMVar8->_vptr_MessageLite + lVar11 * 4);
            if ((int)uVar9 < 0) {
              iVar6 = 10;
            }
            else {
              iVar6 = 1;
              if (0x7f < uVar9) {
                iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
                pMVar8 = (this->field_0).message_value;
              }
            }
            iVar5 = iVar5 + iVar6;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\x11':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            iVar6 = *(int *)((long)pMVar8->_vptr_MessageLite + lVar11 * 4);
            uVar9 = iVar6 >> 0x1f ^ iVar6 * 2;
            iVar6 = 1;
            if (0x7f < uVar9) {
              iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
              pMVar8 = (this->field_0).message_value;
            }
            iVar5 = iVar5 + iVar6;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      case '\x12':
        pMVar8 = (this->field_0).message_value;
        iVar5 = iVar5 * *(int *)&pMVar8[1]._vptr_MessageLite;
        if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
          lVar11 = 0;
          do {
            iVar6 = io::CodedOutputStream::VarintSize64
                              ((long)pMVar8->_vptr_MessageLite[lVar11] >> 0x3f ^
                               (long)pMVar8->_vptr_MessageLite[lVar11] * 2);
            iVar5 = iVar5 + iVar6;
            lVar11 = lVar11 + 1;
            pMVar8 = (this->field_0).message_value;
          } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
          return iVar5;
        }
        return iVar5;
      default:
        goto switchD_0011a82a_default;
      }
      return iVar5 * ((this->field_0).repeated_int32_value)->current_size_;
    }
    if ((byte)(FVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar7 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_61,pLVar7);
      LogMessage::~LogMessage(&local_60);
    }
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      uVar9 = ((this->field_0).repeated_int32_value)->current_size_ << 3;
      goto LAB_0011aa6e;
    case '\x02':
    case '\a':
    case '\x0f':
      uVar9 = ((this->field_0).repeated_int32_value)->current_size_ << 2;
      goto LAB_0011aa6e;
    case '\x03':
      pMVar8 = (this->field_0).message_value;
      if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          iVar5 = io::CodedOutputStream::VarintSize64((uint64)pMVar8->_vptr_MessageLite[lVar11]);
          uVar9 = uVar9 + iVar5;
          lVar11 = lVar11 + 1;
          pMVar8 = (this->field_0).message_value;
        } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
        goto LAB_0011aa6e;
      }
      break;
    case '\x04':
      pMVar8 = (this->field_0).message_value;
      if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          iVar5 = io::CodedOutputStream::VarintSize64((uint64)pMVar8->_vptr_MessageLite[lVar11]);
          uVar9 = uVar9 + iVar5;
          lVar11 = lVar11 + 1;
          pMVar8 = (this->field_0).message_value;
        } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
        goto LAB_0011aa6e;
      }
      break;
    case '\x05':
      pMVar8 = (this->field_0).message_value;
      if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          uVar10 = *(uint *)((long)pMVar8->_vptr_MessageLite + lVar11 * 4);
          if ((int)uVar10 < 0) {
            iVar5 = 10;
          }
          else {
            iVar5 = 1;
            if (0x7f < uVar10) {
              iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar10);
              pMVar8 = (this->field_0).message_value;
            }
          }
          uVar9 = uVar9 + iVar5;
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
        goto LAB_0011aa6e;
      }
      break;
    case '\b':
      uVar9 = ((this->field_0).repeated_int32_value)->current_size_;
LAB_0011aa6e:
      this->cached_size = uVar9;
      if (0 < (int)uVar9) {
        iVar6 = 1;
        iVar5 = 1;
        if (0x7f < uVar9) {
          iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
        }
        if (0x7f < (uint)(number << 3)) {
          iVar6 = io::CodedOutputStream::VarintSize32Fallback(number << 3 | 2);
        }
        return iVar5 + uVar9 + iVar6;
      }
      return uVar9;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x50d);
      pLVar7 = LogMessage::operator<<(&local_60,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_61,pLVar7);
      LogMessage::~LogMessage(&local_60);
      break;
    case '\r':
      pMVar8 = (this->field_0).message_value;
      if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          uVar10 = *(uint *)((long)pMVar8->_vptr_MessageLite + lVar11 * 4);
          iVar5 = 1;
          if (0x7f < uVar10) {
            iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar10);
            pMVar8 = (this->field_0).message_value;
          }
          uVar9 = uVar9 + iVar5;
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
        goto LAB_0011aa6e;
      }
      break;
    case '\x0e':
      pMVar8 = (this->field_0).message_value;
      if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          uVar10 = *(uint *)((long)pMVar8->_vptr_MessageLite + lVar11 * 4);
          if ((int)uVar10 < 0) {
            iVar5 = 10;
          }
          else {
            iVar5 = 1;
            if (0x7f < uVar10) {
              iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar10);
              pMVar8 = (this->field_0).message_value;
            }
          }
          uVar9 = uVar9 + iVar5;
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
        goto LAB_0011aa6e;
      }
      break;
    case '\x11':
      pMVar8 = (this->field_0).message_value;
      if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          iVar5 = *(int *)((long)pMVar8->_vptr_MessageLite + lVar11 * 4);
          uVar10 = iVar5 >> 0x1f ^ iVar5 * 2;
          iVar5 = 1;
          if (0x7f < uVar10) {
            iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar10);
            pMVar8 = (this->field_0).message_value;
          }
          uVar9 = uVar9 + iVar5;
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
        goto LAB_0011aa6e;
      }
      break;
    case '\x12':
      pMVar8 = (this->field_0).message_value;
      if (0 < *(int *)&pMVar8[1]._vptr_MessageLite) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          iVar5 = io::CodedOutputStream::VarintSize64
                            ((long)pMVar8->_vptr_MessageLite[lVar11] >> 0x3f ^
                             (long)pMVar8->_vptr_MessageLite[lVar11] * 2);
          uVar9 = uVar9 + iVar5;
          lVar11 = lVar11 + 1;
          pMVar8 = (this->field_0).message_value;
        } while (lVar11 < *(int *)&pMVar8[1]._vptr_MessageLite);
        goto LAB_0011aa6e;
      }
    }
    this->cached_size = 0;
switchD_0011a82a_default:
    return 0;
  }
  if ((this->field_0xa & 1) != 0) {
    return 0;
  }
  FVar1 = this->type;
  if ((byte)(FVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x35);
    pLVar7 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_61,pLVar7);
    LogMessage::~LogMessage(&local_60);
  }
  iVar5 = 1;
  if (0x7f < (uint)(number << 3)) {
    iVar5 = io::CodedOutputStream::VarintSize32Fallback(number << 3);
  }
  iVar5 = iVar5 << (FVar1 == '\n');
  FVar1 = this->type;
  if ((byte)(FVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x35);
    pLVar7 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_61,pLVar7);
    LogMessage::~LogMessage(&local_60);
  }
  switch(FVar1) {
  case '\x01':
  case '\x06':
  case '\x10':
    iVar5 = iVar5 + 8;
    break;
  case '\x02':
  case '\a':
  case '\x0f':
    iVar5 = iVar5 + 4;
    break;
  case '\x03':
  case '\x04':
    value = (this->field_0).uint64_value;
    goto LAB_0011ad23;
  case '\x05':
  case '\x0e':
    uVar9 = (this->field_0).uint32_value;
    if (-1 < (int)uVar9) goto joined_r0x0011ab1f;
    iVar6 = 10;
    goto LAB_0011ade3;
  case '\b':
    iVar5 = iVar5 + 1;
    break;
  case '\t':
  case '\f':
    pRVar2 = (this->field_0).repeated_int32_value;
    uVar9 = pRVar2->current_size_;
    iVar6 = 1;
    if (0x7f < uVar9) {
      iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
      uVar9 = pRVar2->current_size_;
    }
    iVar5 = uVar9 + iVar5 + iVar6;
    break;
  case '\n':
    iVar6 = (**(code **)(((this->field_0).repeated_int32_value)->elements_ + 0x12))();
    goto LAB_0011ade3;
  case '\v':
    piVar3 = ((this->field_0).repeated_int32_value)->elements_;
    if ((this->field_0xa & 0x10) == 0) {
      uVar9 = (**(code **)(piVar3 + 0x12))();
    }
    else {
      uVar9 = (**(code **)(piVar3 + 0x10))();
    }
    iVar6 = 1;
    if (0x7f < uVar9) {
      iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
    }
    iVar5 = uVar9 + iVar5 + iVar6;
    break;
  case '\r':
    uVar9 = (this->field_0).uint32_value;
    goto joined_r0x0011ab1f;
  case '\x11':
    uVar9 = (this->field_0).int32_value >> 0x1f ^ (this->field_0).int32_value * 2;
joined_r0x0011ab1f:
    iVar6 = 1;
    if (0x7f < uVar9) {
      iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar9);
    }
    goto LAB_0011ade3;
  case '\x12':
    value = (this->field_0).int64_value >> 0x3f ^ (this->field_0).int64_value * 2;
LAB_0011ad23:
    iVar6 = io::CodedOutputStream::VarintSize64(value);
LAB_0011ade3:
    iVar5 = iVar5 + iVar6;
  }
  return iVar5;
}

Assistant:

int ExtensionSet::Extension::ByteSize(int number) const {
  int result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += WireFormatLite::k##CAMELCASE##Size *                    \
                    repeated_##LOWERCASE##_value->size();                   \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = result;
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(
            WireFormatLite::MakeTag(number,
                WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      int tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += tag_size * repeated_##LOWERCASE##_value->size();        \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *       \
                    repeated_##LOWERCASE##_value->size();                   \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                      \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::CAMELCASE##Size(LOWERCASE);             \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          int size = lazymessage_value->ByteSize();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)                                 \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::k##CAMELCASE##Size;                     \
        break
      HANDLE_TYPE( FIXED32,  Fixed32);
      HANDLE_TYPE( FIXED64,  Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(   FLOAT,    Float);
      HANDLE_TYPE(  DOUBLE,   Double);
      HANDLE_TYPE(    BOOL,     Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}